

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O0

void __thiscall deqp::gles2::Functional::ShaderSourceSplitCase::test(ShaderSourceSplitCase *this)

{
  bool bVar1;
  TestLog *this_00;
  RenderContext *renderCtx_00;
  MessageBuilder *this_01;
  MessageBuilder local_248;
  undefined1 local_b8 [8];
  Shader shader;
  ShaderSources sources;
  RenderContext *renderCtx;
  TestLog *log;
  ShaderSourceSplitCase *this_local;
  
  this_00 = tcu::TestContext::getLog
                      ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
  ;
  renderCtx_00 = gles2::Context::getRenderContext((this->super_ApiCase).super_TestCase.m_context);
  Functional::anon_unknown_0::ShaderSources::ShaderSources
            ((ShaderSources *)&shader.m_info.compileTimeUs);
  glu::Shader::Shader((Shader *)local_b8,renderCtx_00,this->m_shaderType);
  generateSources(this,(ShaderSources *)&shader.m_info.compileTimeUs);
  Functional::anon_unknown_0::setShaderSources
            ((Shader *)local_b8,(ShaderSources *)&shader.m_info.compileTimeUs);
  glu::Shader::compile((Shader *)local_b8);
  buildProgram(this,(Shader *)local_b8);
  bVar1 = glu::Shader::getCompileStatus((Shader *)local_b8);
  if (!bVar1) {
    tcu::TestLog::operator<<(&local_248,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    this_01 = tcu::MessageBuilder::operator<<(&local_248,(char (*) [20])"Compilation failed.");
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_248);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Compile failed");
  }
  glu::Shader::~Shader((Shader *)local_b8);
  Functional::anon_unknown_0::ShaderSources::~ShaderSources
            ((ShaderSources *)&shader.m_info.compileTimeUs);
  return;
}

Assistant:

void test (void)
	{
		TestLog&			log			= m_testCtx.getLog();
		glu::RenderContext&	renderCtx	= m_context.getRenderContext();

		ShaderSources		sources;
		glu::Shader			shader		(renderCtx, m_shaderType);

		generateSources(sources);
		setShaderSources(shader, sources);
		shader.compile();

		buildProgram(shader);

		if (!shader.getCompileStatus())
		{
			log << TestLog::Message << "Compilation failed." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		}
	}